

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::batch_normalize_conv
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  double __x;
  resizable_tensor *this;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar11;
  ostream *poVar12;
  fatal_error *pfVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long k_1;
  long lVar20;
  undefined1 auVar21 [32];
  float fVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM6_Qb;
  string local_210;
  resizable_tensor *local_1f0;
  resizable_tensor *local_1e8;
  double local_1e0;
  ostringstream dlib_o_out;
  uint auStack_1c0 [88];
  string *local_60;
  float local_58;
  ostringstream *local_50;
  float local_48;
  ostringstream **local_40;
  string **local_38;
  long lVar8;
  float *pfVar10;
  undefined4 extraout_var_00;
  
  if ((averaging_factor < 0.0) || (1.0 < averaging_factor)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x420);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"0 <= averaging_factor && averaging_factor <= 1");
    std::operator<<(poVar12,".\n");
    puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    std::operator<<((ostream *)&dlib_o_out,"averaging_factor: ");
    poVar12 = std::ostream::_M_insert<double>(averaging_factor);
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_210);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
    bVar4 = have_same_dimensions(&running_means->super_tensor,&means->super_tensor);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x421);
      std::operator<<(poVar12,".\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar12 = std::operator<<(poVar12,
                                "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                               );
      std::operator<<(poVar12,".\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar12 = std::operator<<(poVar12,
                                "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                               );
      std::operator<<(poVar12,".\n\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar12 = std::operator<<(poVar12,
                                "averaging_factor==1 || have_same_dimensions(running_means,means)");
      std::operator<<(poVar12,".\n");
      puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
      *puVar1 = *puVar1 | 1;
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar12,"\n");
      pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_210);
      __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
    }
    bVar4 = have_same_dimensions(&running_variances->super_tensor,&invstds->super_tensor);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x422);
      std::operator<<(poVar12,".\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar12 = std::operator<<(poVar12,
                                "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                               );
      std::operator<<(poVar12,".\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar12 = std::operator<<(poVar12,
                                "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                               );
      std::operator<<(poVar12,".\n\n");
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar12 = std::operator<<(poVar12,
                                "averaging_factor==1 || have_same_dimensions(running_variances,invstds)"
                               );
      std::operator<<(poVar12,".\n");
      puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
      *puVar1 = *puVar1 | 1;
      poVar12 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar12,"\n");
      pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_210);
      __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
    }
  }
  auVar27._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])&beta->m_nr +
       ZEXT116(1) * *(undefined1 (*) [16])&gamma->m_nr;
  auVar27._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])&beta->m_nr;
  auVar21._8_8_ = 1;
  auVar21._0_8_ = 1;
  auVar21._16_8_ = 1;
  auVar21._24_8_ = 1;
  auVar21 = vpxorq_avx512vl(auVar27,auVar21);
  local_1e8 = running_means;
  if (((((auVar21 != (undefined1  [32])0x0) || (gamma->m_n != 1)) || (src->m_n < 2)) ||
      ((beta->m_n != 1 || (gamma->m_k != beta->m_k)))) || ((eps <= 0.0 || (gamma->m_k != src->m_k)))
     ) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x439);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_conv(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,
                              "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == 1 && beta.nr() == 1 && gamma.nc() == 1 && beta.nc() == 1 && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
                             );
    std::operator<<(poVar12,".\n");
    puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar12 = std::operator<<((ostream *)&dlib_o_out,"\ngamma.num_samples(): ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\ngamma.k():  ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\ngamma.nr(): ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\ngamma.nc(): ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nbeta.num_samples(): ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nbeta.k():   ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nbeta.nr():  ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nbeta.nc():  ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nsrc.k():   ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nsrc.nr():  ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    poVar12 = std::operator<<(poVar12,"\nsrc.nc():  ");
    poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
    std::operator<<(poVar12,"\neps:  ");
    poVar12 = std::ostream::_M_insert<double>(eps);
    std::operator<<(poVar12,"\n");
    pfVar13 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar13,EBROKEN_ASSERT,&local_210);
    __cxa_throw(pfVar13,&fatal_error::typeinfo,error::~error);
  }
  local_1f0 = dest;
  resizable_tensor::copy_size(dest,src);
  resizable_tensor::set_size(means,1,src->m_k,1,1);
  resizable_tensor::set_size(invstds,1,src->m_k,1,1);
  tensor::operator=(&means->super_tensor,0.0);
  tensor::operator=(&invstds->super_tensor,0.0);
  iVar5 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  lVar8 = CONCAT44(extraout_var,iVar5);
  iVar5 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar9 = CONCAT44(extraout_var_00,iVar5);
  iVar5 = (*gamma->_vptr_tensor[2])(gamma);
  iVar6 = (*beta->_vptr_tensor[2])(beta);
  iVar7 = (*src->_vptr_tensor[2])();
  pfVar10 = (float *)CONCAT44(extraout_var_03,iVar7);
  uVar2 = src->m_n;
  uVar19 = src->m_nc * src->m_nr;
  uVar3 = src->m_k;
  uVar14 = ~((long)uVar19 >> 0x3f) & uVar19;
  for (uVar15 = 0; uVar15 != (~((long)uVar2 >> 0x3f) & uVar2); uVar15 = uVar15 + 1) {
    for (uVar16 = 0; uVar18 = uVar14, uVar16 != (~((long)uVar3 >> 0x3f) & uVar3);
        uVar16 = uVar16 + 1) {
      while (uVar18 != 0) {
        *(float *)(lVar9 + uVar16 * 4) = *pfVar10 + *(float *)(lVar9 + uVar16 * 4);
        fVar22 = *pfVar10;
        pfVar10 = pfVar10 + 1;
        auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),
                                  ZEXT416(*(uint *)(lVar8 + uVar16 * 4)));
        *(int *)(lVar8 + uVar16 * 4) = auVar25._0_4_;
        uVar18 = uVar18 - 1;
      }
    }
  }
  tensor::operator/=(&means->super_tensor,(float)(long)(uVar2 * uVar19));
  tensor::operator/=(&invstds->super_tensor,(float)(long)(src->m_n * uVar19));
  (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  (*(means->super_tensor)._vptr_tensor[3])();
  (*src->_vptr_tensor[2])(src);
  resizable_tensor::copy_size(running_variances,&invstds->super_tensor);
  iVar7 = (*(running_variances->super_tensor)._vptr_tensor[3])();
  dVar23 = (double)(long)(uVar19 * src->m_n);
  dVar23 = dVar23 / (dVar23 + -1.0);
  local_1e0 = dVar23 * averaging_factor;
  for (lVar20 = 0; lVar20 < src->m_k; lVar20 = lVar20 + 1) {
    auVar25 = ZEXT416(*(uint *)(lVar9 + lVar20 * 4));
    auVar25 = vfnmadd213ss_fma(auVar25,auVar25,ZEXT416(*(uint *)(lVar8 + lVar20 * 4)));
    fVar22 = auVar25._0_4_;
    if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
      auVar28._0_8_ = (double)*(float *)(CONCAT44(extraout_var_04,iVar7) + lVar20 * 4);
      auVar28._8_8_ = in_XMM6_Qb;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = 1.0 - averaging_factor;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (double)fVar22 * local_1e0;
      auVar25 = vfmadd231sd_fma(auVar29,auVar28,auVar25);
      dVar24 = auVar25._0_8_;
    }
    else {
      dVar24 = (double)fVar22 * dVar23;
    }
    __x = (double)fVar22 + eps;
    *(float *)(CONCAT44(extraout_var_04,iVar7) + lVar20 * 4) = (float)dVar24;
    if (__x < 0.0) {
      dVar24 = sqrt(__x);
    }
    else {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = __x;
      auVar25 = vsqrtsd_avx(auVar26,auVar26);
      dVar24 = auVar25._0_8_;
    }
    *(float *)(lVar8 + lVar20 * 4) = (float)(1.0 / dVar24);
  }
  iVar7 = (*src->_vptr_tensor[2])();
  lVar20 = CONCAT44(extraout_var_05,iVar7);
  iVar7 = (*(local_1f0->super_tensor)._vptr_tensor[3])();
  this = local_1e8;
  lVar11 = CONCAT44(extraout_var_06,iVar7);
  uVar2 = src->m_n;
  uVar3 = src->m_k;
  for (uVar15 = 0; uVar15 != (~((long)uVar2 >> 0x3f) & uVar2); uVar15 = uVar15 + 1) {
    for (uVar19 = 0; uVar19 != (~((long)uVar3 >> 0x3f) & uVar3); uVar19 = uVar19 + 1) {
      lVar17 = 0;
      for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
        lVar17 = lVar17 + -4;
        fVar22 = (*(float *)(lVar20 + uVar16 * 4) - *(float *)(lVar9 + uVar19 * 4)) *
                 *(float *)(lVar8 + uVar19 * 4);
        *(float *)(lVar11 + uVar16 * 4) = fVar22;
        auVar25 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_01,iVar5) + uVar19 * 4)),
                                  ZEXT416((uint)fVar22),
                                  ZEXT416(*(uint *)(CONCAT44(extraout_var_02,iVar6) + uVar19 * 4)));
        *(int *)(lVar11 + uVar16 * 4) = auVar25._0_4_;
      }
      lVar20 = lVar20 - lVar17;
      lVar11 = lVar11 - lVar17;
    }
  }
  resizable_tensor::copy_size(local_1e8,&means->super_tensor);
  if ((averaging_factor == 1.0) && (!NAN(averaging_factor))) {
    resizable_tensor::operator=(this,means);
    return;
  }
  mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&dlib_o_out,&this->super_tensor);
  local_48 = (float)(1.0 - averaging_factor);
  local_50 = &dlib_o_out;
  mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&local_210,&means->super_tensor);
  local_58 = (float)averaging_factor;
  local_38 = &local_60;
  local_60 = &local_210;
  local_40 = &local_50;
  resizable_tensor::operator=
            (this,(matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                   *)&local_40);
  return;
}

Assistant:

void batch_normalize_conv (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == 1 && 
                beta.nr() == 1 && 
                gamma.nc() == 1 && 
                beta.nc() == 1 && 
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc()  <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k());
            invstds.set_size(1, src.k());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            auto p_src = src.host();
            const long num = src.nr()*src.nc();
            // compute means, and sum of squares
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        p_means[k] += *p_src;
                        p_invstds[k] += (*p_src)*(*p_src);
                        ++p_src;
                    }
                }
            }
            means /= src.num_samples()*num;
            invstds /= src.num_samples()*num;
            // copy data back to host
            invstds.host(); means.host();

            p_src = src.host();
            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples()*num)/(src.num_samples()*num-1.0);
            for (long k = 0; k < src.k(); ++k)
            {
                float actual_var = p_invstds[k] - p_means[k]*p_means[k];
                if (averaging_factor == 1)
                    rvar[k] = scale*actual_var;
                else
                    rvar[k] = (1-averaging_factor)*rvar[k] + scale*averaging_factor*actual_var;

                p_invstds[k] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < src.k(); ++k)
                {
                    for (long i = 0; i < num; ++i)
                    {
                        *p_dest = (*p_src - p_means[k])*p_invstds[k];
                        *p_dest = (*p_dest)*p_gamma[k] + p_beta[k];
                        ++p_src;
                        ++p_dest;
                    }
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }